

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

pid_t __thiscall TuxProc::Process::attach(Process *this,char *processName)

{
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  char *__s1;
  char *in_RSI;
  int *in_RDI;
  char *szFileName;
  size_t pathLength;
  char truePath [4096];
  char symbolicPath [128];
  uint32_t id;
  dirent *entry;
  char *error;
  DIR *procDirectory;
  char local_10b8 [4096];
  char local_b8 [132];
  int local_34;
  dirent *local_30;
  char *local_28;
  DIR *local_20;
  char *local_18;
  int local_4;
  
  *in_RDI = 0;
  local_18 = in_RSI;
  local_20 = opendir("/proc");
  if (local_20 == (DIR *)0x0) {
    local_4 = *in_RDI;
  }
  else {
    do {
      do {
        do {
          local_30 = readdir(local_20);
          if (local_30 == (dirent *)0x0) goto LAB_00105c5b;
          uVar2 = strtol(local_30->d_name,&local_28,10);
          local_34 = (int)uVar2;
        } while ((local_34 == 0) || (*local_28 != '\0'));
        snprintf(local_b8,0x80,"/proc/%u/exe",uVar2 & 0xffffffff);
        sVar3 = readlink(local_b8,local_10b8,0x1000);
      } while (sVar3 == 0);
      local_10b8[sVar3] = '\0';
      __s1 = __xpg_basename(local_10b8);
      iVar1 = strcmp(__s1,local_18);
    } while (iVar1 != 0);
    *in_RDI = local_34;
LAB_00105c5b:
    closedir(local_20);
    local_4 = *in_RDI;
  }
  return local_4;
}

Assistant:

pid_t Process::attach(const char* processName)
{
    // ** search processes for one with processName by inspecting each /proc/<uid>/exe path

    // open proc directory
    processID = 0;
    DIR* procDirectory = opendir("/proc");
    if (!procDirectory) {
        return processID;
    }

    // parse directory files
    char* error;
    struct dirent* entry;
    while ((entry = readdir(procDirectory))) {
        // name of file is the pid
        uint32_t id = strtol(entry->d_name, &error, 10);
        if (id == 0 || *error != 0) {
            continue;
        }
        char symbolicPath[128];
        char truePath[FILENAME_MAX];

        // resolve path of exe symlink
        snprintf(symbolicPath, sizeof(symbolicPath), "/proc/%u/exe", id);
        size_t pathLength = readlink(symbolicPath, truePath, sizeof(truePath));
        if (pathLength > 0) {
            truePath[pathLength] = 0;
            // check if executable name matches supplied processName
            const char* szFileName = basename(truePath);
            if (strcmp(szFileName, processName) == 0) {
                processID = id;
                break;
            }
        }
    }
    closedir(procDirectory);
    return processID;
}